

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void expectEqualIssues(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *issues,LoggerPtr *logger)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  bool bVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_reference lhs;
  AssertHelper local_b0 [8];
  Message local_a8 [8];
  shared_ptr<libcellml::Issue> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  size_t i;
  Message local_50 [24];
  unsigned_long local_38;
  size_type local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  LoggerPtr *logger_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *issues_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)logger;
  local_30 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(issues);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_38 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_28,"issues.size()","logger->issueCount()",&local_30,&local_38)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar3) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xdd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    sVar1.ptr_ = gtest_ar_1.message_.ptr_;
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             libcellml::Logger::issueCount();
    sVar2 = gtest_ar_1.message_;
    bVar3 = false;
    if (sVar1.ptr_ < pbVar5) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(issues);
      bVar3 = sVar2.ptr_ < pbVar5;
    }
    if (!bVar3) break;
    lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(issues,(size_type)gtest_ar_1.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_a0);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_a0);
    libcellml::Issue::description_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_70,"issues.at(i)","logger->issue(i)->description()",lhs,
               &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_a0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar3) {
      testing::Message::Message(local_a8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                (local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0xdf,pcVar4);
      testing::internal::AssertHelper::operator=(local_b0,local_a8);
      testing::internal::AssertHelper::~AssertHelper(local_b0);
      testing::Message::~Message(local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_1.message_.ptr_)->field_0x1;
  }
  return;
}

Assistant:

void expectEqualIssues(const std::vector<std::string> &issues, const libcellml::LoggerPtr &logger)

{
    EXPECT_EQ(issues.size(), logger->issueCount());
    for (size_t i = 0; i < logger->issueCount() && i < issues.size(); ++i) {
        EXPECT_EQ(issues.at(i), logger->issue(i)->description());
    }
}